

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_exponent<char,fmt::v8::appender>(int exp,appender it)

{
  undefined1 uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)exp;
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar5 = lVar2 + 1;
  if (exp < 0) {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar5;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar2) = 0x2d;
    uVar4 = (ulong)(uint)-exp;
  }
  else {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar5;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar2) = 0x2b;
  }
  uVar3 = (uint)uVar4;
  if (99 < uVar3) {
    if (999 < uVar3) {
      uVar1 = basic_data<void>::digits[(uVar4 / 100) * 2];
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                    0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar2 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x10) = uVar5;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
       + lVar2) = uVar1;
    }
    uVar1 = basic_data<void>::digits[(uVar4 / 100) * 2 + 1];
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    uVar3 = uVar3 + (int)(uVar4 / 100) * -100;
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar5;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar2) = uVar1;
  }
  uVar1 = basic_data<void>::digits[(ulong)uVar3 * 2];
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar5 = lVar2 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) < uVar5) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
  }
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       uVar5;
  *(undefined1 *)
   (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
   lVar2) = uVar1;
  uVar1 = basic_data<void>::digits[(ulong)uVar3 * 2 + 1];
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar5 = lVar2 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) < uVar5) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
  }
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       uVar5;
  *(undefined1 *)
   (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
   lVar2) = uVar1;
  return (appender)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container
  ;
}

Assistant:

auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}